

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::
log_<fmt::v7::basic_string_view<char>,unsigned_long,unsigned_long,unsigned_long,unsigned_int&,unsigned_long&,unsigned_long&>
          (logger *this,source_loc loc,level_enum lvl,basic_string_view<char> *fmt,
          unsigned_long *args,unsigned_long *args_1,unsigned_long *args_2,uint *args_3,
          unsigned_long *args_4,unsigned_long *args_5)

{
  source_loc loc_00;
  char *s;
  size_t count;
  exception *ex;
  string_view_t local_218;
  string_view_t local_208;
  char *local_1f8;
  int iStack_1f0;
  undefined4 uStack_1ec;
  char *local_1e8;
  undefined1 local_1e0 [8];
  log_msg log_msg;
  allocator<char> local_161;
  undefined1 local_160 [8];
  memory_buf_t buf;
  bool traceback_enabled;
  bool log_enabled;
  unsigned_long *args_local_2;
  unsigned_long *args_local_1;
  unsigned_long *args_local;
  basic_string_view<char> *fmt_local;
  level_enum lvl_local;
  logger *this_local;
  
  buf._287_1_ = should_log(this,lvl);
  buf._286_1_ = details::backtracer::enabled(&this->tracer_);
  if (((buf._287_1_ & 1) != 0) || ((bool)buf._286_1_)) {
    std::allocator<char>::allocator();
    ::fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_160,&local_161);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    log_msg.payload.size_ =
         (size_t)::fmt::v7::
                 format_to<fmt::v7::basic_string_view<char>,unsigned_long,unsigned_long,unsigned_long,unsigned_int&,unsigned_long&,unsigned_long&,250ul,char>
                           ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_160,fmt
                            ,args,args_1,args_2,args_3,args_4,args_5);
    local_1e8 = loc.funcname;
    local_1f8 = loc.filename;
    iStack_1f0 = loc.line;
    uStack_1ec = loc._12_4_;
    ::fmt::v7::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>(&local_208,&this->name_);
    s = ::fmt::v7::detail::buffer<char>::data((buffer<char> *)local_160);
    count = ::fmt::v7::detail::buffer<char>::size((buffer<char> *)local_160);
    ::fmt::v7::basic_string_view<char>::basic_string_view(&local_218,s,count);
    loc_00.line = iStack_1f0;
    loc_00._12_4_ = uStack_1ec;
    loc_00.filename = local_1f8;
    loc_00.funcname = local_1e8;
    details::log_msg::log_msg((log_msg *)local_1e0,loc_00,local_208,lvl,local_218);
    log_it_(this,(log_msg *)local_1e0,(bool)(buf._287_1_ & 1),(bool)(buf._286_1_ & 1));
    ::fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::~basic_memory_buffer
              ((basic_memory_buffer<char,_250UL,_std::allocator<char>_> *)local_160);
  }
  return;
}

Assistant:

void log_(source_loc loc, level::level_enum lvl, const FormatString &fmt, Args&&...args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return;
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::format_to(buf, fmt, std::forward<Args>(args)...);
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            log_it_(log_msg, log_enabled, traceback_enabled);
        }